

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O0

SymbolTable * __thiscall
hdc::SymbolTableBuilderVisitor::pushSymbolTable(SymbolTableBuilderVisitor *this)

{
  SymbolTable *parent;
  SymbolTable *this_00;
  SymbolTable *old;
  SymbolTableBuilderVisitor *this_local;
  
  parent = this->symbolTable;
  std::
  stack<hdc::SymbolTable_*,_std::deque<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>_>::
  push(&this->symbolTableStack,&this->symbolTable);
  this_00 = (SymbolTable *)operator_new(0x48);
  SymbolTable::SymbolTable(this_00,parent);
  this->symbolTable = this_00;
  return this->symbolTable;
}

Assistant:

SymbolTable *SymbolTableBuilderVisitor::pushSymbolTable() {
    SymbolTable* old;

    old = symbolTable;
    symbolTableStack.push(symbolTable);
    symbolTable = new SymbolTable(old);

    return symbolTable;
}